

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O3

ssize_t __thiscall xmrig::Client::send(Client *this,int __fd,void *__buf,size_t __n,int __flags)

{
  SendResult *this_00;
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  undefined4 extraout_var_00;
  undefined4 in_register_00000034;
  pair<const_long,_xmrig::BaseClient::SendResult> local_58;
  
  iVar1 = (*(this->super_BaseClient).super_IClient._vptr_IClient[0xf])();
  local_58.first = CONCAT44(extraout_var,iVar1);
  this_00 = &local_58.second;
  std::
  function<void_(const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_&,_bool,_unsigned_long)>
  ::function(&this_00->callback,
             (function<void_(const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_&,_bool,_unsigned_long)>
              *)__buf);
  lVar2 = std::chrono::_V2::steady_clock::now();
  local_58.second.ts = lVar2 / 1000000;
  std::
  _Rb_tree<long,std::pair<long_const,xmrig::BaseClient::SendResult>,std::_Select1st<std::pair<long_const,xmrig::BaseClient::SendResult>>,std::less<long>,std::allocator<std::pair<long_const,xmrig::BaseClient::SendResult>>>
  ::_M_insert_unique<std::pair<long_const,xmrig::BaseClient::SendResult>>
            ((_Rb_tree<long,std::pair<long_const,xmrig::BaseClient::SendResult>,std::_Select1st<std::pair<long_const,xmrig::BaseClient::SendResult>>,std::less<long>,std::allocator<std::pair<long_const,xmrig::BaseClient::SendResult>>>
              *)&(this->super_BaseClient).m_callbacks,&local_58);
  if (local_58.second.callback.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_58.second.callback.super__Function_base._M_manager)
              ((_Any_data *)this_00,(_Any_data *)this_00,__destroy_functor);
  }
  iVar1 = (*(this->super_BaseClient).super_IClient._vptr_IClient[0xe])
                    (this,CONCAT44(in_register_00000034,__fd));
  return CONCAT44(extraout_var_00,iVar1);
}

Assistant:

int64_t xmrig::Client::send(const rapidjson::Value &obj, Callback callback)
{
    assert(obj["id"] == sequence());

    m_callbacks.insert({ sequence(), std::move(callback) });

    return send(obj);
}